

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::F_formatter<spdlog::details::scoped_padder>::format
          (F_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  size_t sVar1;
  long lVar2;
  uint uVar3;
  char *__src;
  int iVar4;
  ptrdiff_t _Num;
  size_t __n;
  duration duration;
  ulong uVar5;
  scoped_padder p;
  scoped_padder sStack_78;
  format_int local_50;
  
  uVar5 = (msg->time).__d.__r % 1000000000;
  scoped_padder::scoped_padder(&sStack_78,9,&(this->super_flag_formatter).padinfo_,dest);
  lVar2 = 0x3f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar3 = (uVar3 + 1) -
          (uint)(uVar5 < *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                   (ulong)uVar3 * 8));
  if (uVar3 < 9) {
    iVar4 = 9 - uVar3;
    do {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar1 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar1 + 1;
      (dest->super_buffer<char>).ptr_[sVar1] = '0';
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  __src = fmt::v6::format_int::format_decimal(&local_50,uVar5);
  __n = (long)(local_50.buffer_ + 0x15) - (long)__src;
  uVar5 = (dest->super_buffer<char>).size_ + __n;
  local_50.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
  }
  if (local_50.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar5;
  scoped_padder::~scoped_padder(&sStack_78);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }